

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_short,unsigned_short,0>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_short *lhs,unsigned_short *rhs,unsigned_short *result)

{
  ushort uVar1;
  ushort uVar2;
  unsigned_short uVar3;
  undefined2 *in_RDX;
  ushort *in_RSI;
  ushort *in_RDI;
  int32_t tmp;
  
  uVar1 = *in_RDI;
  uVar2 = *in_RSI;
  uVar3 = std::numeric_limits<unsigned_short>::max();
  if ((uint)uVar1 + (uint)uVar2 <= (uint)uVar3) {
    *in_RDX = (short)((uint)uVar1 + (uint)uVar2);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        //16-bit or less unsigned addition
        std::int32_t tmp = lhs + rhs;

        if( tmp <= (std::int32_t)std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }